

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

LoopGenerateSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LoopGenerateSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::MemberSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,Token *args_5,
          ExpressionSyntax *args_6,Token *args_7,ExpressionSyntax *args_8,Token *args_9,
          ExpressionSyntax *args_10,Token *args_11,MemberSyntax *args_12)

{
  Info *pIVar1;
  Info *pIVar2;
  size_t sVar3;
  pointer ppAVar4;
  Info *pIVar5;
  Info *pIVar6;
  Info *pIVar7;
  Info *pIVar8;
  Info *pIVar9;
  Info *pIVar10;
  SyntaxNode *pSVar11;
  undefined4 uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  TokenKind TVar17;
  undefined1 uVar18;
  NumericTokenFlags NVar19;
  uint32_t uVar20;
  TokenKind TVar21;
  undefined1 uVar22;
  NumericTokenFlags NVar23;
  uint32_t uVar24;
  TokenKind TVar25;
  undefined1 uVar26;
  NumericTokenFlags NVar27;
  uint32_t uVar28;
  TokenKind TVar29;
  undefined1 uVar30;
  NumericTokenFlags NVar31;
  uint32_t uVar32;
  TokenKind TVar33;
  undefined1 uVar34;
  NumericTokenFlags NVar35;
  uint32_t uVar36;
  TokenKind TVar37;
  undefined1 uVar38;
  NumericTokenFlags NVar39;
  uint32_t uVar40;
  TokenKind TVar41;
  undefined1 uVar42;
  NumericTokenFlags NVar43;
  uint32_t uVar44;
  LoopGenerateSyntax *pLVar45;
  long lVar46;
  
  pLVar45 = (LoopGenerateSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((LoopGenerateSyntax *)this->endPtr < pLVar45 + 1) {
    pLVar45 = (LoopGenerateSyntax *)allocateSlow(this,0xf0,8);
  }
  else {
    this->head->current = (byte *)(pLVar45 + 1);
  }
  TVar13 = args_1->kind;
  uVar14 = args_1->field_0x2;
  NVar15.raw = (args_1->numFlags).raw;
  uVar16 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar21 = args_3->kind;
  uVar22 = args_3->field_0x2;
  NVar23.raw = (args_3->numFlags).raw;
  uVar24 = args_3->rawLen;
  pIVar5 = args_3->info;
  TVar17 = args_2->kind;
  uVar18 = args_2->field_0x2;
  NVar19.raw = (args_2->numFlags).raw;
  uVar20 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar25 = args_4->kind;
  uVar26 = args_4->field_0x2;
  NVar27.raw = (args_4->numFlags).raw;
  uVar28 = args_4->rawLen;
  pIVar6 = args_4->info;
  TVar29 = args_5->kind;
  uVar30 = args_5->field_0x2;
  NVar31.raw = (args_5->numFlags).raw;
  uVar32 = args_5->rawLen;
  pIVar7 = args_5->info;
  TVar33 = args_7->kind;
  uVar34 = args_7->field_0x2;
  NVar35.raw = (args_7->numFlags).raw;
  uVar36 = args_7->rawLen;
  pIVar8 = args_7->info;
  TVar37 = args_9->kind;
  uVar38 = args_9->field_0x2;
  NVar39.raw = (args_9->numFlags).raw;
  uVar40 = args_9->rawLen;
  pIVar9 = args_9->info;
  TVar41 = args_11->kind;
  uVar42 = args_11->field_0x2;
  NVar43.raw = (args_11->numFlags).raw;
  uVar44 = args_11->rawLen;
  pIVar10 = args_11->info;
  (pLVar45->super_MemberSyntax).super_SyntaxNode.kind = LoopGenerate;
  (pLVar45->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pLVar45->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar12 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar11 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pLVar45->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(pLVar45->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       uVar12;
  (pLVar45->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar11;
  (pLVar45->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pLVar45->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0062ede0;
  (pLVar45->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar3 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pLVar45->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_ptr;
  (pLVar45->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar3;
  (pLVar45->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0062f0b8;
  (pLVar45->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pLVar45;
  sVar3 = (pLVar45->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar3 != 0) {
    ppAVar4 = (pLVar45->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar46 = 0;
    do {
      *(LoopGenerateSyntax **)(*(long *)((long)ppAVar4 + lVar46) + 8) = pLVar45;
      lVar46 = lVar46 + 8;
    } while (sVar3 << 3 != lVar46);
  }
  (pLVar45->keyword).kind = TVar13;
  (pLVar45->keyword).field_0x2 = uVar14;
  (pLVar45->keyword).numFlags = (NumericTokenFlags)NVar15.raw;
  (pLVar45->keyword).rawLen = uVar16;
  (pLVar45->keyword).info = pIVar1;
  (pLVar45->openParen).kind = TVar17;
  (pLVar45->openParen).field_0x2 = uVar18;
  (pLVar45->openParen).numFlags = (NumericTokenFlags)NVar19.raw;
  (pLVar45->openParen).rawLen = uVar20;
  (pLVar45->openParen).info = pIVar2;
  (pLVar45->genvar).kind = TVar21;
  (pLVar45->genvar).field_0x2 = uVar22;
  (pLVar45->genvar).numFlags = (NumericTokenFlags)NVar23.raw;
  (pLVar45->genvar).rawLen = uVar24;
  (pLVar45->genvar).info = pIVar5;
  (pLVar45->identifier).kind = TVar25;
  (pLVar45->identifier).field_0x2 = uVar26;
  (pLVar45->identifier).numFlags = (NumericTokenFlags)NVar27.raw;
  (pLVar45->identifier).rawLen = uVar28;
  (pLVar45->identifier).info = pIVar6;
  (pLVar45->equals).kind = TVar29;
  (pLVar45->equals).field_0x2 = uVar30;
  (pLVar45->equals).numFlags = (NumericTokenFlags)NVar31.raw;
  (pLVar45->equals).rawLen = uVar32;
  (pLVar45->equals).info = pIVar7;
  (pLVar45->initialExpr).ptr = args_6;
  (pLVar45->semi1).kind = TVar33;
  (pLVar45->semi1).field_0x2 = uVar34;
  (pLVar45->semi1).numFlags = (NumericTokenFlags)NVar35.raw;
  (pLVar45->semi1).rawLen = uVar36;
  (pLVar45->semi1).info = pIVar8;
  (pLVar45->stopExpr).ptr = args_8;
  (pLVar45->semi2).kind = TVar37;
  (pLVar45->semi2).field_0x2 = uVar38;
  (pLVar45->semi2).numFlags = (NumericTokenFlags)NVar39.raw;
  (pLVar45->semi2).rawLen = uVar40;
  (pLVar45->semi2).info = pIVar9;
  (pLVar45->iterationExpr).ptr = args_10;
  (pLVar45->closeParen).kind = TVar41;
  (pLVar45->closeParen).field_0x2 = uVar42;
  (pLVar45->closeParen).numFlags = (NumericTokenFlags)NVar43.raw;
  (pLVar45->closeParen).rawLen = uVar44;
  (pLVar45->closeParen).info = pIVar10;
  (pLVar45->block).ptr = args_12;
  (args_6->super_SyntaxNode).parent = (SyntaxNode *)pLVar45;
  (args_8->super_SyntaxNode).parent = (SyntaxNode *)pLVar45;
  (args_10->super_SyntaxNode).parent = (SyntaxNode *)pLVar45;
  (args_12->super_SyntaxNode).parent = (SyntaxNode *)pLVar45;
  return pLVar45;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }